

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

wchar_t check_symlinks(archive_write_disk *a)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  uint *puVar4;
  archive *in_RDI;
  bool bVar5;
  char *p;
  stat st;
  wchar_t r;
  char c;
  char *pn;
  size_t n;
  void *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff44;
  undefined1 in_stack_ffffffffffffff45;
  undefined1 uVar6;
  undefined1 in_stack_ffffffffffffff47;
  char *local_b8;
  stat local_b0;
  char cVar7;
  archive *paVar8;
  
  pcVar2 = (char *)in_RDI[3].error_string.length;
  if (in_RDI[2].vtable != (archive_vtable_conflict *)0x0) {
    local_b8 = *(char **)(in_RDI + 2);
    while( true ) {
      bVar5 = false;
      if (*pcVar2 != '\0') {
        bVar5 = *local_b8 == *pcVar2;
      }
      if (!bVar5) break;
      local_b8 = local_b8 + 1;
      pcVar2 = pcVar2 + 1;
    }
    in_stack_ffffffffffffff47 = 0;
  }
  cVar7 = *pcVar2;
  do {
    while( true ) {
      uVar6 = false;
      if ((*pcVar2 != '\0') &&
         (in_stack_ffffffffffffff45 = true, uVar6 = in_stack_ffffffffffffff45, *pcVar2 == '/')) {
        in_stack_ffffffffffffff45 = pcVar2[1] != '\0';
        uVar6 = in_stack_ffffffffffffff45;
      }
      if ((bool)uVar6 == false) goto LAB_0028a2f6;
      while( true ) {
        in_stack_ffffffffffffff44 = false;
        if (*pcVar2 != '\0') {
          in_stack_ffffffffffffff44 = *pcVar2 != '/';
        }
        if ((bool)in_stack_ffffffffffffff44 == false) break;
        pcVar2 = pcVar2 + 1;
      }
      cVar7 = *pcVar2;
      *pcVar2 = '\0';
      iVar1 = lstat((char *)in_RDI[3].error_string.length,&local_b0);
      if (iVar1 != 0) break;
      if ((local_b0.st_mode & 0xf000) == 0xa000) {
        if (cVar7 == '\0') {
          iVar1 = unlink((char *)in_RDI[3].error_string.length);
          if (iVar1 != 0) {
            paVar8 = in_RDI;
            puVar4 = (uint *)__errno_location();
            archive_set_error(in_RDI,(int)(ulong)*puVar4,"Could not remove symlink %s",
                              paVar8[3].error_string.length);
            *pcVar2 = cVar7;
            return L'\xffffffe7';
          }
          in_RDI[3].error = (char *)0x0;
          if (((ulong)in_RDI[4].compression_name & 0xf00000000000) != 0xa00000000000) {
            archive_set_error(in_RDI,0,"Removing symlink %s",in_RDI[3].error_string.length);
          }
          *pcVar2 = cVar7;
          return L'\0';
        }
        if ((in_RDI[4].magic & 0x10) == 0) {
          archive_set_error(in_RDI,0,"Cannot extract through symlink %s",
                            in_RDI[3].error_string.length);
          *pcVar2 = cVar7;
          return L'\xffffffe7';
        }
        iVar1 = unlink((char *)in_RDI[3].error_string.length);
        if (iVar1 != 0) {
          archive_set_error(in_RDI,0,"Cannot remove intervening symlink %s",
                            in_RDI[3].error_string.length);
          *pcVar2 = cVar7;
          return L'\xffffffe7';
        }
        in_RDI[3].error = (char *)0x0;
      }
    }
    piVar3 = __errno_location();
  } while (*piVar3 != 2);
LAB_0028a2f6:
  *pcVar2 = cVar7;
  in_RDI[2].vtable = (archive_vtable_conflict *)0x0;
  n = in_RDI[3].error_string.length;
  if (in_RDI[3].error_string.length != 0) {
    strlen((char *)in_RDI[3].error_string.length);
  }
  archive_strncat((archive_string *)
                  CONCAT17(in_stack_ffffffffffffff47,
                           CONCAT16(uVar6,CONCAT15(in_stack_ffffffffffffff45,
                                                   CONCAT14(in_stack_ffffffffffffff44,
                                                            in_stack_ffffffffffffff40)))),
                  in_stack_ffffffffffffff38,n);
  return L'\0';
}

Assistant:

static int
check_symlinks(struct archive_write_disk *a)
{
#if !defined(HAVE_LSTAT)
	/* Platform doesn't have lstat, so we can't look for symlinks. */
	(void)a; /* UNUSED */
	return (ARCHIVE_OK);
#else
	char *pn;
	char c;
	int r;
	struct stat st;

	/*
	 * Guard against symlink tricks.  Reject any archive entry whose
	 * destination would be altered by a symlink.
	 */
	/* Whatever we checked last time doesn't need to be re-checked. */
	pn = a->name;
	if (archive_strlen(&(a->path_safe)) > 0) {
		char *p = a->path_safe.s;
		while ((*pn != '\0') && (*p == *pn))
			++p, ++pn;
	}
	c = pn[0];
	/* Keep going until we've checked the entire name. */
	while (pn[0] != '\0' && (pn[0] != '/' || pn[1] != '\0')) {
		/* Skip the next path element. */
		while (*pn != '\0' && *pn != '/')
			++pn;
		c = pn[0];
		pn[0] = '\0';
		/* Check that we haven't hit a symlink. */
		r = lstat(a->name, &st);
		if (r != 0) {
			/* We've hit a dir that doesn't exist; stop now. */
			if (errno == ENOENT)
				break;
		} else if (S_ISLNK(st.st_mode)) {
			if (c == '\0') {
				/*
				 * Last element is symlink; remove it
				 * so we can overwrite it with the
				 * item being extracted.
				 */
				if (unlink(a->name)) {
					archive_set_error(&a->archive, errno,
					    "Could not remove symlink %s",
					    a->name);
					pn[0] = c;
					return (ARCHIVE_FAILED);
				}
				a->pst = NULL;
				/*
				 * Even if we did remove it, a warning
				 * is in order.  The warning is silly,
				 * though, if we're just replacing one
				 * symlink with another symlink.
				 */
				if (!S_ISLNK(a->mode)) {
					archive_set_error(&a->archive, 0,
					    "Removing symlink %s",
					    a->name);
				}
				/* Symlink gone.  No more problem! */
				pn[0] = c;
				return (0);
			} else if (a->flags & ARCHIVE_EXTRACT_UNLINK) {
				/* User asked us to remove problems. */
				if (unlink(a->name) != 0) {
					archive_set_error(&a->archive, 0,
					    "Cannot remove intervening symlink %s",
					    a->name);
					pn[0] = c;
					return (ARCHIVE_FAILED);
				}
				a->pst = NULL;
			} else {
				archive_set_error(&a->archive, 0,
				    "Cannot extract through symlink %s",
				    a->name);
				pn[0] = c;
				return (ARCHIVE_FAILED);
			}
		}
	}
	pn[0] = c;
	/* We've checked and/or cleaned the whole path, so remember it. */
	archive_strcpy(&a->path_safe, a->name);
	return (ARCHIVE_OK);
#endif
}